

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis<double,int,long_double>
                 (size_t col_num,size_t nrows,double *Xc,int *Xc_ind,int *Xc_indptr,
                 MissingAction missing_action)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  longdouble in_ST0;
  longdouble lVar4;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar9;
  longdouble in_ST5;
  double in_XMM0_Qa;
  double __value;
  double extraout_XMM0_Qa;
  double dVar10;
  double extraout_XMM0_Qa_00;
  double __value_00;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  longdouble out;
  longdouble v;
  longdouble sn;
  longdouble cnt_l;
  int ix_1;
  int ix;
  longdouble xval;
  size_t cnt;
  longdouble x_sq;
  longdouble s4;
  longdouble s3;
  longdouble s2;
  longdouble s1;
  MissingAction in_stack_fffffffffffffeb4;
  double *in_stack_fffffffffffffeb8;
  undefined2 in_stack_fffffffffffffec0;
  undefined6 in_stack_fffffffffffffec2;
  int *in_stack_fffffffffffffec8;
  undefined2 in_stack_fffffffffffffed0;
  undefined6 in_stack_fffffffffffffed2;
  size_t in_stack_fffffffffffffed8;
  byte local_111;
  int local_b0;
  int local_ac;
  ulong local_90;
  longdouble local_78;
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  double local_8;
  
  if (*(int *)(in_R8 + in_RDI * 4) == *(int *)(in_R8 + 4 + in_RDI * 4)) {
    local_8 = -INFINITY;
  }
  else {
    local_78 = (longdouble)0;
    if (in_RSI < 2) {
      local_8 = -INFINITY;
    }
    else {
      local_90 = in_RSI;
      local_48 = local_78;
      if (in_R9D == 0) {
        local_68 = local_78;
        local_58 = local_78;
        for (local_b0 = *(int *)(in_R8 + in_RDI * 4); lVar8 = in_ST2, lVar7 = in_ST1, lVar6 = in_ST0
            , local_b0 < *(int *)(in_R8 + 4 + in_RDI * 4); local_b0 = local_b0 + 1) {
          lVar5 = (longdouble)*(double *)(in_RDX + (long)local_b0 * 8);
          local_48 = local_48 + lVar5;
          dVar10 = std::fma(in_XMM0_Qa,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
          lVar4 = in_ST5;
          lVar9 = in_ST5;
          dVar10 = std::fma(dVar10,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
          in_stack_fffffffffffffec8 = SUB108(local_78,0);
          in_stack_fffffffffffffed0 = (undefined2)((unkuint10)local_78 >> 0x40);
          in_stack_fffffffffffffeb8 = SUB108(lVar5 * lVar5,0);
          in_stack_fffffffffffffec0 = (undefined2)((unkuint10)(lVar5 * lVar5) >> 0x40);
          lVar5 = lVar9;
          in_XMM0_Qa = std::fma(dVar10,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
          in_ST0 = in_ST3;
          in_ST1 = in_ST4;
          in_ST2 = in_ST5;
          in_ST3 = lVar4;
          in_ST4 = lVar9;
          in_ST5 = lVar5;
          local_78 = lVar8;
          local_68 = lVar7;
          local_58 = lVar6;
        }
      }
      else {
        local_68 = local_78;
        local_58 = local_78;
        for (local_ac = *(int *)(in_R8 + in_RDI * 4); local_ac < *(int *)(in_R8 + 4 + in_RDI * 4);
            local_ac = local_ac + 1) {
          lVar4 = (longdouble)*(double *)(in_RDX + (long)local_ac * 8);
          uVar2 = std::isnan(in_XMM0_Qa);
          local_111 = 1;
          lVar6 = in_ST0;
          lVar7 = in_ST1;
          lVar8 = in_ST2;
          in_XMM0_Qa = __value;
          if ((uVar2 & 1) == 0) {
            iVar3 = std::isinf(__value);
            local_111 = (byte)iVar3;
            lVar6 = in_ST0;
            lVar7 = in_ST1;
            lVar8 = in_ST2;
            in_XMM0_Qa = extraout_XMM0_Qa;
          }
          if ((local_111 & 1) == 0) {
            local_48 = local_48 + lVar4;
            dVar10 = std::fma(in_XMM0_Qa,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
            lVar9 = in_ST5;
            lVar5 = in_ST5;
            dVar10 = std::fma(dVar10,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
            in_stack_fffffffffffffec8 = SUB108(local_78,0);
            in_stack_fffffffffffffed0 = (undefined2)((unkuint10)local_78 >> 0x40);
            in_stack_fffffffffffffeb8 = SUB108(lVar4 * lVar4,0);
            in_stack_fffffffffffffec0 = (undefined2)((unkuint10)(lVar4 * lVar4) >> 0x40);
            lVar4 = lVar5;
            in_XMM0_Qa = std::fma(dVar10,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),in_XMM2_Qa);
            in_ST0 = in_ST3;
            in_ST1 = in_ST4;
            in_ST2 = in_ST5;
            in_ST3 = lVar9;
            in_ST4 = lVar5;
            in_ST5 = lVar4;
            local_78 = lVar8;
            local_68 = lVar7;
            local_58 = lVar6;
          }
          else {
            local_90 = local_90 - 1;
            in_ST0 = lVar6;
            in_ST1 = lVar7;
            in_ST2 = lVar8;
          }
        }
        if (local_90 <=
            in_RSI - (long)(*(int *)(in_R8 + 4 + in_RDI * 4) - *(int *)(in_R8 + in_RDI * 4))) {
          return -INFINITY;
        }
      }
      bVar1 = true;
      if (1 < local_90) {
        bVar1 = true;
        if ((local_58 != (longdouble)0) || (NAN(local_58) || NAN((longdouble)0))) {
          bVar1 = local_48 * local_48 == local_58;
        }
      }
      if (bVar1) {
        local_8 = -INFINITY;
      }
      else {
        lVar6 = (longdouble)(float)(&DAT_006c0110)[(long)local_90 < 0] + (longdouble)(long)local_90;
        lVar7 = local_48 / lVar6;
        lVar8 = local_58 / lVar6 - lVar7 * lVar7;
        uVar2 = std::isnan(in_XMM0_Qa);
        if ((uVar2 & 1) == 0) {
          dVar10 = std::numeric_limits<double>::epsilon();
          if (((longdouble)dVar10 < lVar8) ||
             (bVar1 = check_more_than_two_unique_values<double,int>
                                (in_stack_fffffffffffffed8,
                                 CONCAT62(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0),
                                 in_stack_fffffffffffffec8,
                                 (int *)CONCAT62(in_stack_fffffffffffffec2,in_stack_fffffffffffffec0
                                                ),in_stack_fffffffffffffeb8,
                                 in_stack_fffffffffffffeb4), dVar10 = extraout_XMM0_Qa_00, bVar1)) {
            if (lVar8 <= (longdouble)0) {
              local_8 = 0.0;
            }
            else {
              lVar4 = lVar7 * lVar7 * lVar7;
              uVar2 = std::isnan(dVar10);
              if (((uVar2 & 1) == 0) && (uVar2 = std::isinf(__value_00), (uVar2 & 1) == 0)) {
                local_8 = (double)((lVar4 * lVar7 * lVar6 +
                                   (((longdouble)6.0 * local_58 * lVar7 * lVar7 +
                                    (local_78 - local_68 * (longdouble)4.0 * lVar7)) -
                                   local_48 * (longdouble)4.0 * lVar4)) / (lVar8 * lVar8 * lVar6));
                if (local_8 <= 0.0) {
                  local_8 = 0.0;
                }
              }
              else {
                local_8 = -INFINITY;
              }
            }
          }
          else {
            local_8 = -INFINITY;
          }
        }
        else {
          local_8 = -INFINITY;
        }
      }
    }
  }
  return local_8;
}

Assistant:

double calc_kurtosis(size_t col_num, size_t nrows,
                     real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     MissingAction missing_action)
{
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    size_t cnt = nrows;

    if (unlikely(cnt <= 1)) return -HUGE_VAL;

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xval = Xc[ix];
            if (unlikely(is_na_or_inf(xval)))
            {
                cnt--;
            }

            else
            {
                x_sq = square(xval);
                s1 += xval;
                s2  = std::fma(xval, xval, s2);
                s3  = std::fma(x_sq, xval, s3);
                s4  = std::fma(x_sq, x_sq, s4);
                // s1 += pw1(xval);
                // s2 += pw2(xval);
                // s3 += pw3(xval);
                // s4 += pw4(xval);
            }
        }

        if (cnt <= (nrows) - (Xc_indptr[col_num+1] - Xc_indptr[col_num])) return -HUGE_VAL;
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xval = Xc[ix];
            x_sq = square(xval);
            s1 += xval;
            s2  = std::fma(xval, xval, s2);
            s3  = std::fma(x_sq, xval, s3);
            s4  = std::fma(x_sq, x_sq, s4);
            // s1 += pw1(xval);
            // s2 += pw2(xval);
            // s3 += pw3(xval);
            // s4 += pw4(xval);
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe cnt_l = (ldouble_safe) cnt;
    ldouble_safe sn = s1 / cnt_l;
    ldouble_safe v  = s2 / cnt_l - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(nrows, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt_l * pw4(sn)) / (cnt_l * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}